

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::DestroyNode(InnerMap *this,Node *node)

{
  Arena *pAVar1;
  Node *node_local;
  InnerMap *this_local;
  
  pAVar1 = internal::MapAllocator<void_*>::arena(&this->alloc_);
  if ((pAVar1 == (Arena *)0x0) && (node != (Node *)0x0)) {
    Node::~Node(node);
    operator_delete(node,0x48);
  }
  return;
}

Assistant:

void DestroyNode(Node* node) {
      if (alloc_.arena() == nullptr) {
        delete node;
      }
    }